

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luckySwap.c
# Opt level: O2

int Kit_TruthCountOnes_64bit(word *pIn,int nVars)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  
  uVar3 = (ulong)(uint)(1 << ((char)nVars - 6U & 0x1f));
  if (nVars < 7) {
    uVar3 = 1;
  }
  iVar2 = 0;
  for (; 0 < (int)uVar3; uVar3 = uVar3 - 1) {
    iVar1 = Kit_WordCountOnes_64bit(pIn[uVar3 - 1]);
    iVar2 = iVar2 + iVar1;
  }
  return iVar2;
}

Assistant:

int Kit_TruthCountOnes_64bit( word* pIn, int nVars )
{
    int w, Counter = 0;
    for ( w = Kit_TruthWordNum_64bit(nVars)-1; w >= 0; w-- )
        Counter += Kit_WordCountOnes_64bit(pIn[w]);
    return Counter;
}